

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444.c
# Opt level: O0

uint64_t rfc5497_timetlv_decode(uint8_t encoded)

{
  byte bVar1;
  uint8_t b;
  uint8_t a;
  ulong uStack_10;
  uint8_t encoded_local;
  
  if (encoded == '\0') {
    uStack_10 = 0;
  }
  else if (encoded == 0xff) {
    uStack_10 = 0xffffffffffffffff;
  }
  else {
    bVar1 = (byte)((int)(uint)encoded >> 3);
    if (bVar1 < 0xb) {
      uStack_10 = (ulong)(encoded & 7) * 0x7d + 1000 >> (10 - bVar1 & 0x3f);
    }
    else {
      uStack_10 = (ulong)(encoded & 7) * 0x7d + 1000 << (bVar1 - 10 & 0x3f);
    }
  }
  return uStack_10;
}

Assistant:

uint64_t
rfc5497_timetlv_decode(uint8_t encoded) {
  /*
   * time-value := (1 + a/8) * 2^b * C
   * time-code := 8 * b + a
   */
  uint8_t a, b;

  if (encoded == 0) {
    /* minimum valid time interval */
    return 0;
  }

  if (encoded == 255) {
    /* return 'infinite' */
    return UINT64_MAX;
  }

  a = encoded & 0x07;
  b = encoded >> 3;

  /*
   * C is 1000/1024 for us, because we calculate in ms
   *
   * t = (1 + a/8) * 2^b * 1000 / 1024
   *   = (1000 + 125 * a) * 2^b / 2^10
   *
   * Case 1: b <= 10
   *   = (1000 + 125 * a) >> (10 - b)
   *
   * Case 2: b > 10
   *   = (1000 + 125 * a) << (b - 10)
   */

  if (b <= 10) {
    return (1000ull + 125ull * a) >> (10ull - b);
  }
  return (1000ull + 125ull * a) << (b - 10ull);
}